

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeyboardImpl.cpp
# Opt level: O0

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sf::Keyboard::Scan::Scancode,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sf::Keyboard::Scan::Scancode>_>_>
* (anonymous_namespace)::GetNameScancodeMap_abi_cxx11_(void)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sf::Keyboard::Scan::Scancode,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sf::Keyboard::Scan::Scancode>_>_>
  *in_RDI;
  pair<const_char_*,_sf::Keyboard::Scan::Scancode> pVar1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sf::Keyboard::Scan::Scancode,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sf::Keyboard::Scan::Scancode>_>_>
  *mapping;
  undefined7 in_stack_ffffffffffffcb38;
  undefined1 in_stack_ffffffffffffcb3f;
  char (*in_stack_ffffffffffffcb40) [5];
  undefined4 in_stack_ffffffffffffcb48;
  undefined4 in_stack_ffffffffffffcb4c;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sf::Keyboard::Scan::Scancode,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sf::Keyboard::Scan::Scancode>_>_>
  *in_stack_ffffffffffffcb50;
  
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sf::Keyboard::Scan::Scancode,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sf::Keyboard::Scan::Scancode>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sf::Keyboard::Scan::Scancode,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sf::Keyboard::Scan::Scancode>_>_>
         *)0x2fe56f);
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[4],sf::Keyboard::Scan::Scancode>
            ((char (*) [4])in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[4],sf::Keyboard::Scan::Scancode>
            ((char (*) [4])in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[4],sf::Keyboard::Scan::Scancode>
            ((char (*) [4])in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[4],sf::Keyboard::Scan::Scancode>
            ((char (*) [4])in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[3],sf::Keyboard::Scan::Scancode>
            ((char (*) [3])in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[4],sf::Keyboard::Scan::Scancode>
            ((char (*) [4])in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[4],sf::Keyboard::Scan::Scancode>
            ((char (*) [4])in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[4],sf::Keyboard::Scan::Scancode>
            ((char (*) [4])in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[4],sf::Keyboard::Scan::Scancode>
            ((char (*) [4])in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[4],sf::Keyboard::Scan::Scancode>
            ((char (*) [4])in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[4],sf::Keyboard::Scan::Scancode>
            ((char (*) [4])in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[4],sf::Keyboard::Scan::Scancode>
            ((char (*) [4])in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[4],sf::Keyboard::Scan::Scancode>
            ((char (*) [4])in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[4],sf::Keyboard::Scan::Scancode>
            ((char (*) [4])in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[4],sf::Keyboard::Scan::Scancode>
            ((char (*) [4])in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[4],sf::Keyboard::Scan::Scancode>
            ((char (*) [4])in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
            (in_stack_ffffffffffffcb40,
             (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            (in_stack_ffffffffffffcb50,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(in_stack_ffffffffffffcb4c,in_stack_ffffffffffffcb48));
  pVar1 = std::make_pair<char_const(&)[5],sf::Keyboard::Scan::Scancode>
                    (in_stack_ffffffffffffcb40,
                     (Scancode *)CONCAT17(in_stack_ffffffffffffcb3f,in_stack_ffffffffffffcb38));
  std::
  map<std::__cxx11::string,sf::Keyboard::Scan::Scancode,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,sf::Keyboard::Scan::Scancode>>>
  ::insert<std::pair<char_const*,sf::Keyboard::Scan::Scancode>>
            ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sf::Keyboard::Scan::Scancode,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sf::Keyboard::Scan::Scancode>_>_>
              *)pVar1.first,
             (pair<const_char_*,_sf::Keyboard::Scan::Scancode> *)
             CONCAT44(pVar1.second,in_stack_ffffffffffffcb48));
  return in_RDI;
}

Assistant:

std::map<std::string, sf::Keyboard::Scancode> GetNameScancodeMap()
{
    std::map<std::string, sf::Keyboard::Scancode> mapping;

    mapping.insert(std::make_pair("LSGT", sf::Keyboard::Scan::NonUsBackslash));

    mapping.insert(std::make_pair("TLDE", sf::Keyboard::Scan::Grave));
    mapping.insert(std::make_pair("AE01", sf::Keyboard::Scan::Num1));
    mapping.insert(std::make_pair("AE02", sf::Keyboard::Scan::Num2));
    mapping.insert(std::make_pair("AE03", sf::Keyboard::Scan::Num3));
    mapping.insert(std::make_pair("AE04", sf::Keyboard::Scan::Num4));
    mapping.insert(std::make_pair("AE05", sf::Keyboard::Scan::Num5));
    mapping.insert(std::make_pair("AE06", sf::Keyboard::Scan::Num6));
    mapping.insert(std::make_pair("AE07", sf::Keyboard::Scan::Num7));
    mapping.insert(std::make_pair("AE08", sf::Keyboard::Scan::Num8));
    mapping.insert(std::make_pair("AE09", sf::Keyboard::Scan::Num9));
    mapping.insert(std::make_pair("AE10", sf::Keyboard::Scan::Num0));
    mapping.insert(std::make_pair("AE11", sf::Keyboard::Scan::Hyphen));
    mapping.insert(std::make_pair("AE12", sf::Keyboard::Scan::Equal));
    mapping.insert(std::make_pair("BKSP", sf::Keyboard::Scan::Backspace));
    mapping.insert(std::make_pair("TAB",  sf::Keyboard::Scan::Tab));
    mapping.insert(std::make_pair("AD01", sf::Keyboard::Scan::Q));
    mapping.insert(std::make_pair("AD02", sf::Keyboard::Scan::W));
    mapping.insert(std::make_pair("AD03", sf::Keyboard::Scan::E));
    mapping.insert(std::make_pair("AD04", sf::Keyboard::Scan::R));
    mapping.insert(std::make_pair("AD05", sf::Keyboard::Scan::T));
    mapping.insert(std::make_pair("AD06", sf::Keyboard::Scan::Y));
    mapping.insert(std::make_pair("AD07", sf::Keyboard::Scan::U));
    mapping.insert(std::make_pair("AD08", sf::Keyboard::Scan::I));
    mapping.insert(std::make_pair("AD09", sf::Keyboard::Scan::O));
    mapping.insert(std::make_pair("AD10", sf::Keyboard::Scan::P));
    mapping.insert(std::make_pair("AD11", sf::Keyboard::Scan::LBracket));
    mapping.insert(std::make_pair("AD12", sf::Keyboard::Scan::RBracket));
    mapping.insert(std::make_pair("BKSL", sf::Keyboard::Scan::Backslash));
    mapping.insert(std::make_pair("RTRN", sf::Keyboard::Scan::Enter));

    mapping.insert(std::make_pair("CAPS", sf::Keyboard::Scan::CapsLock));
    mapping.insert(std::make_pair("AC01", sf::Keyboard::Scan::A));
    mapping.insert(std::make_pair("AC02", sf::Keyboard::Scan::S));
    mapping.insert(std::make_pair("AC03", sf::Keyboard::Scan::D));
    mapping.insert(std::make_pair("AC04", sf::Keyboard::Scan::F));
    mapping.insert(std::make_pair("AC05", sf::Keyboard::Scan::G));
    mapping.insert(std::make_pair("AC06", sf::Keyboard::Scan::H));
    mapping.insert(std::make_pair("AC07", sf::Keyboard::Scan::J));
    mapping.insert(std::make_pair("AC08", sf::Keyboard::Scan::K));
    mapping.insert(std::make_pair("AC09", sf::Keyboard::Scan::L));
    mapping.insert(std::make_pair("AC10", sf::Keyboard::Scan::Semicolon));
    mapping.insert(std::make_pair("AC11", sf::Keyboard::Scan::Apostrophe));
    mapping.insert(std::make_pair("AC12", sf::Keyboard::Scan::Backslash));

    mapping.insert(std::make_pair("LFSH", sf::Keyboard::Scan::LShift));
    mapping.insert(std::make_pair("AB01", sf::Keyboard::Scan::Z));
    mapping.insert(std::make_pair("AB02", sf::Keyboard::Scan::X));
    mapping.insert(std::make_pair("AB03", sf::Keyboard::Scan::C));
    mapping.insert(std::make_pair("AB04", sf::Keyboard::Scan::V));
    mapping.insert(std::make_pair("AB05", sf::Keyboard::Scan::B));
    mapping.insert(std::make_pair("AB06", sf::Keyboard::Scan::N));
    mapping.insert(std::make_pair("AB07", sf::Keyboard::Scan::M));
    mapping.insert(std::make_pair("AB08", sf::Keyboard::Scan::Comma));
    mapping.insert(std::make_pair("AB09", sf::Keyboard::Scan::Period));
    mapping.insert(std::make_pair("AB10", sf::Keyboard::Scan::Slash));
    mapping.insert(std::make_pair("RTSH", sf::Keyboard::Scan::RShift));

    mapping.insert(std::make_pair("LCTL", sf::Keyboard::Scan::LControl));
    mapping.insert(std::make_pair("LALT", sf::Keyboard::Scan::LAlt));
    mapping.insert(std::make_pair("SPCE", sf::Keyboard::Scan::Space));
    mapping.insert(std::make_pair("RCTL", sf::Keyboard::Scan::RControl));
    mapping.insert(std::make_pair("RALT", sf::Keyboard::Scan::RAlt));
    mapping.insert(std::make_pair("LVL3", sf::Keyboard::Scan::RAlt));
    mapping.insert(std::make_pair("ALGR", sf::Keyboard::Scan::RAlt));
    mapping.insert(std::make_pair("LWIN", sf::Keyboard::Scan::LSystem));
    mapping.insert(std::make_pair("RWIN", sf::Keyboard::Scan::RSystem));

    mapping.insert(std::make_pair("HYPR", sf::Keyboard::Scan::Application));
    mapping.insert(std::make_pair("EXEC", sf::Keyboard::Scan::Execute));
    mapping.insert(std::make_pair("MDSW", sf::Keyboard::Scan::ModeChange));
    mapping.insert(std::make_pair("MENU", sf::Keyboard::Scan::Menu));
    mapping.insert(std::make_pair("COMP", sf::Keyboard::Scan::Menu));
    mapping.insert(std::make_pair("SELE", sf::Keyboard::Scan::Select));

    mapping.insert(std::make_pair("ESC",  sf::Keyboard::Scan::Escape));
    mapping.insert(std::make_pair("FK01", sf::Keyboard::Scan::F1));
    mapping.insert(std::make_pair("FK02", sf::Keyboard::Scan::F2));
    mapping.insert(std::make_pair("FK03", sf::Keyboard::Scan::F3));
    mapping.insert(std::make_pair("FK04", sf::Keyboard::Scan::F4));
    mapping.insert(std::make_pair("FK05", sf::Keyboard::Scan::F5));
    mapping.insert(std::make_pair("FK06", sf::Keyboard::Scan::F6));
    mapping.insert(std::make_pair("FK07", sf::Keyboard::Scan::F7));
    mapping.insert(std::make_pair("FK08", sf::Keyboard::Scan::F8));
    mapping.insert(std::make_pair("FK09", sf::Keyboard::Scan::F9));
    mapping.insert(std::make_pair("FK10", sf::Keyboard::Scan::F10));
    mapping.insert(std::make_pair("FK11", sf::Keyboard::Scan::F11));
    mapping.insert(std::make_pair("FK12", sf::Keyboard::Scan::F12));

    mapping.insert(std::make_pair("PRSC", sf::Keyboard::Scan::PrintScreen));
    mapping.insert(std::make_pair("SCLK", sf::Keyboard::Scan::ScrollLock));
    mapping.insert(std::make_pair("PAUS", sf::Keyboard::Scan::Pause));

    mapping.insert(std::make_pair("INS",  sf::Keyboard::Scan::Insert));
    mapping.insert(std::make_pair("HOME", sf::Keyboard::Scan::Home));
    mapping.insert(std::make_pair("PGUP", sf::Keyboard::Scan::PageUp));
    mapping.insert(std::make_pair("DELE", sf::Keyboard::Scan::Delete));
    mapping.insert(std::make_pair("END",  sf::Keyboard::Scan::End));
    mapping.insert(std::make_pair("PGDN", sf::Keyboard::Scan::PageDown));

    mapping.insert(std::make_pair("UP",   sf::Keyboard::Scan::Up));
    mapping.insert(std::make_pair("RGHT", sf::Keyboard::Scan::Right));
    mapping.insert(std::make_pair("DOWN", sf::Keyboard::Scan::Down));
    mapping.insert(std::make_pair("LEFT", sf::Keyboard::Scan::Left));

    mapping.insert(std::make_pair("NMLK", sf::Keyboard::Scan::NumLock));
    mapping.insert(std::make_pair("KPDV", sf::Keyboard::Scan::NumpadDivide));
    mapping.insert(std::make_pair("KPMU", sf::Keyboard::Scan::NumpadMultiply));
    mapping.insert(std::make_pair("KPSU", sf::Keyboard::Scan::NumpadMinus));

    mapping.insert(std::make_pair("KP7",  sf::Keyboard::Scan::Numpad7));
    mapping.insert(std::make_pair("KP8",  sf::Keyboard::Scan::Numpad8));
    mapping.insert(std::make_pair("KP9",  sf::Keyboard::Scan::Numpad9));
    mapping.insert(std::make_pair("KPAD", sf::Keyboard::Scan::NumpadPlus));
    mapping.insert(std::make_pair("KP4",  sf::Keyboard::Scan::Numpad4));
    mapping.insert(std::make_pair("KP5",  sf::Keyboard::Scan::Numpad5));
    mapping.insert(std::make_pair("KP6",  sf::Keyboard::Scan::Numpad6));
    mapping.insert(std::make_pair("KP1",  sf::Keyboard::Scan::Numpad1));
    mapping.insert(std::make_pair("KP2",  sf::Keyboard::Scan::Numpad2));
    mapping.insert(std::make_pair("KP3",  sf::Keyboard::Scan::Numpad3));
    mapping.insert(std::make_pair("KPEN", sf::Keyboard::Scan::NumpadEnter));
    mapping.insert(std::make_pair("KP0",  sf::Keyboard::Scan::Numpad0));
    mapping.insert(std::make_pair("KPDL", sf::Keyboard::Scan::NumpadDecimal));
    mapping.insert(std::make_pair("KPEQ", sf::Keyboard::Scan::NumpadEqual));

    mapping.insert(std::make_pair("FK13", sf::Keyboard::Scan::F13));
    mapping.insert(std::make_pair("FK14", sf::Keyboard::Scan::F14));
    mapping.insert(std::make_pair("FK15", sf::Keyboard::Scan::F15));
    mapping.insert(std::make_pair("FK16", sf::Keyboard::Scan::F16));
    mapping.insert(std::make_pair("FK17", sf::Keyboard::Scan::F17));
    mapping.insert(std::make_pair("FK18", sf::Keyboard::Scan::F18));
    mapping.insert(std::make_pair("FK19", sf::Keyboard::Scan::F19));
    mapping.insert(std::make_pair("FK20", sf::Keyboard::Scan::F20));
    mapping.insert(std::make_pair("FK21", sf::Keyboard::Scan::F21));
    mapping.insert(std::make_pair("FK22", sf::Keyboard::Scan::F22));
    mapping.insert(std::make_pair("FK23", sf::Keyboard::Scan::F23));
    mapping.insert(std::make_pair("FK24", sf::Keyboard::Scan::F24));
    mapping.insert(std::make_pair("LMTA", sf::Keyboard::Scan::LSystem));
    mapping.insert(std::make_pair("RMTA", sf::Keyboard::Scan::RSystem));
    mapping.insert(std::make_pair("MUTE", sf::Keyboard::Scan::VolumeMute));
    mapping.insert(std::make_pair("VOL-", sf::Keyboard::Scan::VolumeDown));
    mapping.insert(std::make_pair("VOL+", sf::Keyboard::Scan::VolumeUp));
    mapping.insert(std::make_pair("STOP", sf::Keyboard::Scan::Stop));
    mapping.insert(std::make_pair("REDO", sf::Keyboard::Scan::Redo));
    mapping.insert(std::make_pair("AGAI", sf::Keyboard::Scan::Redo));
    mapping.insert(std::make_pair("UNDO", sf::Keyboard::Scan::Undo));
    mapping.insert(std::make_pair("COPY", sf::Keyboard::Scan::Copy));
    mapping.insert(std::make_pair("PAST", sf::Keyboard::Scan::Paste));
    mapping.insert(std::make_pair("FIND", sf::Keyboard::Scan::Search));
    mapping.insert(std::make_pair("CUT",  sf::Keyboard::Scan::Cut));
    mapping.insert(std::make_pair("HELP", sf::Keyboard::Scan::Help));

    mapping.insert(std::make_pair("I156", sf::Keyboard::Scan::LaunchApplication1));
    mapping.insert(std::make_pair("I157", sf::Keyboard::Scan::LaunchApplication2));
    mapping.insert(std::make_pair("I164", sf::Keyboard::Scan::Favorites));
    mapping.insert(std::make_pair("I166", sf::Keyboard::Scan::Back));
    mapping.insert(std::make_pair("I167", sf::Keyboard::Scan::Forward));
    mapping.insert(std::make_pair("I171", sf::Keyboard::Scan::MediaNextTrack));
    mapping.insert(std::make_pair("I172", sf::Keyboard::Scan::MediaPlayPause));
    mapping.insert(std::make_pair("I173", sf::Keyboard::Scan::MediaPreviousTrack));
    mapping.insert(std::make_pair("I174", sf::Keyboard::Scan::MediaStop));
    mapping.insert(std::make_pair("I180", sf::Keyboard::Scan::HomePage));
    mapping.insert(std::make_pair("I181", sf::Keyboard::Scan::Refresh));
    mapping.insert(std::make_pair("I223", sf::Keyboard::Scan::LaunchMail));
    mapping.insert(std::make_pair("I234", sf::Keyboard::Scan::LaunchMediaSelect));

    return mapping;
}